

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&>
          (ValidationContext *this,IssueError *issue,uint *args,uchar *args_1,uchar *args_2,
          uchar *args_3,uchar *args_4,uchar *args_5,uchar *args_6,uchar *args_7,uchar *args_8)

{
  format_args args_00;
  string_view fmt;
  allocator<char> local_111;
  undefined1 local_110 [40];
  string local_e8;
  ulong local_c8 [2];
  ulong local_b8;
  ulong local_a8;
  ulong local_98;
  ulong local_88;
  ulong local_78;
  ulong local_68;
  ulong local_58;
  ulong local_48;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_110[0] = (issue->super_Issue).type;
  local_110._2_2_ = (issue->super_Issue).id;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(local_110 + 8),&(issue->super_Issue).message,&local_111);
  local_c8[0] = (ulong)*args;
  local_b8 = (ulong)*args_1;
  local_a8 = (ulong)*args_2;
  local_98 = (ulong)*args_3;
  local_88 = (ulong)*args_4;
  local_78 = (ulong)*args_5;
  local_68 = (ulong)*args_6;
  local_58 = (ulong)*args_7;
  local_48 = (ulong)*args_8;
  args_00.field_1._0_1_ = *args_2;
  args_00.desc_ = (unsigned_long_long)local_c8;
  args_00.field_1._1_7_ = 0;
  fmt.size_ = 0x222222222;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_e8,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            (&this->callback,(ValidationReport *)local_110);
  ValidationReport::~ValidationReport((ValidationReport *)local_110);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }